

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCoveredByIndex(Expr *pExpr,int iCur,Index *pIdx)

{
  IdxCover xcov;
  Walker w;
  Index *pIdx_local;
  int iCur_local;
  Expr *pExpr_local;
  
  memset(&xcov.iCur,0,0x30);
  xcov.pIdx._0_4_ = iCur;
  sqlite3WalkExpr((Walker *)&xcov.iCur,pExpr);
  return (int)((w.xSelectCallback2._4_1_ != '\0' ^ 0xffU) & 1);
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCoveredByIndex(
  Expr *pExpr,        /* The index to be tested */
  int iCur,           /* The cursor number for the corresponding table */
  Index *pIdx         /* The index that might be used for coverage */
){
  Walker w;
  struct IdxCover xcov;
  memset(&w, 0, sizeof(w));
  xcov.iCur = iCur;
  xcov.pIdx = pIdx;
  w.xExprCallback = exprIdxCover;
  w.u.pIdxCover = &xcov;
  sqlite3WalkExpr(&w, pExpr);
  return !w.eCode;
}